

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arg_lit.c
# Opt level: O1

int arg_lit_scanfn(arg_lit *parent,char *argval)

{
  int iVar1;
  
  iVar1 = 2;
  if (parent->count < (parent->hdr).maxcount) {
    parent->count = parent->count + 1;
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

static int arg_lit_scanfn(struct arg_lit* parent, const char* argval) {
    int errorcode = 0;
    if (parent->count < parent->hdr.maxcount)
        parent->count++;
    else
        errorcode = ARG_ERR_MAXCOUNT;

    ARG_TRACE(("%s:scanfn(%p,%s) returns %d\n", __FILE__, parent, argval, errorcode));
    return errorcode;
}